

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlated_normal_dist.hpp
# Opt level: O0

void __thiscall
trng::correlated_normal_dist<double>::param_type::Cholesky_factorization(param_type *this)

{
  double dVar1;
  reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar3;
  size_type k_1;
  size_type j_1;
  result_type t;
  size_type j;
  result_type t_1;
  size_type k;
  size_type i;
  pointer local_40;
  pointer local_38;
  double local_30;
  pointer local_28;
  double local_20;
  pointer local_18;
  pointer local_10;
  
  for (local_10 = (pointer)0x0;
      local_10 <
      in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start; local_10 = (pointer)((long)local_10 + 1)) {
    for (local_18 = (pointer)0x0; local_18 < local_10; local_18 = (pointer)((long)local_18 + 1)) {
      local_20 = 0.0;
      for (local_28 = (pointer)0x0; local_28 < local_18; local_28 = (pointer)((long)local_28 + 1)) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RDI,(size_type)
                                   ((long)local_10 *
                                    (long)in_RDI[1].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + (long)local_28)
                           );
        dVar3 = *pvVar2;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RDI,(size_type)
                                   ((long)local_18 *
                                    (long)in_RDI[1].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + (long)local_28)
                           );
        local_20 = dVar3 * *pvVar2 + local_20;
      }
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RDI,(size_type)
                                 ((long)local_10 *
                                  (long)in_RDI[1].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + (long)local_18));
      dVar3 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RDI,(size_type)
                                 ((long)local_18 *
                                  (long)in_RDI[1].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + (long)local_18));
      dVar1 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RDI,(size_type)
                                 ((long)local_10 *
                                  (long)in_RDI[1].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + (long)local_18));
      *pvVar2 = (dVar3 - local_20) / dVar1;
    }
    local_30 = 0.0;
    for (local_38 = (pointer)0x0; local_38 < local_10; local_38 = (pointer)((long)local_38 + 1)) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RDI,(size_type)
                                 ((long)local_10 *
                                  (long)in_RDI[1].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + (long)local_38));
      dVar3 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RDI,(size_type)
                                 ((long)local_10 *
                                  (long)in_RDI[1].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + (long)local_38));
      local_30 = dVar3 * *pvVar2 + local_30;
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_RDI,(size_type)
                               ((long)local_10 *
                                (long)in_RDI[1].super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start + (long)local_10));
    dVar3 = sqrt(*pvVar2 - local_30);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_RDI,(size_type)
                               ((long)local_10 *
                                (long)in_RDI[1].super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start + (long)local_10));
    *pvVar2 = dVar3;
    local_40 = local_10;
    while (local_40 = (pointer)((long)local_40 + 1),
          local_40 <
          in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RDI,(size_type)
                                 ((long)local_10 *
                                  (long)in_RDI[1].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + (long)local_40));
      *pvVar2 = 0.0;
    }
  }
  return;
}

Assistant:

void Cholesky_factorization() {
        for (size_type i{0}; i < d_; ++i) {
          for (size_type k{0}; k < i; ++k) {
            result_type t{0};
            for (size_type j{0}; j < k; ++j)
              t += H_[i * d_ + j] * H_[k * d_ + j];
            H_[i * d_ + k] = (H_[i * d_ + k] - t) / H_[k * d_ + k];
          }
          result_type t{0};
          for (size_type j{0}; j < i; ++j)
            t += H_[i * d_ + j] * H_[i * d_ + j];
          H_[i * d_ + i] = trng::math::sqrt(H_[i * d_ + i] - t);
          for (size_type k{i + 1}; k < d_; ++k)
            H_[i * d_ + k] = 0;
        }
      }